

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O0

bool goodform::is<long>(any *v)

{
  bool bVar1;
  type_info *this;
  any *v_local;
  
  this = std::any::type(v);
  bVar1 = std::type_info::operator==(this,(type_info *)&long::typeinfo);
  return bVar1;
}

Assistant:

bool is(const any& v)
  {
    return v.type() == typeid(T);
  }